

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COMBICState.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::COMBICState::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,COMBICState *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  EnvironmentRecord::GetAsString_abi_cxx11_(&local_1c0,&this->super_EnvironmentRecord);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tTime Since Creation:       ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tMunition Source:           ");
  EntityType::GetAsString_abi_cxx11_(&local_1e0,&this->m_MunSrc);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\tNumber Of Sources:         ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tGeometry Index:            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16GeometryIndex);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tSource Type:               ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tBarrage Rate:              ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32BarrageRate);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tBarrage Duration:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32BarrageDuration);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tBarrage Crosswind Length:  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32BarrageCrosswindLength);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tBarrage Downwind Length:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32BarrageDownwindLength);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tDetonation Velocity:       ");
  EulerAngles::GetAsString_abi_cxx11_(&local_200,&this->m_DetVel);
  std::operator<<(poVar1,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString COMBICState::GetAsString() const
{
    KStringStream ss;

    ss << EnvironmentRecord::GetAsString()
       << "\tTime Since Creation:       " << m_ui32TSC                   << "\n"
       << "\tMunition Source:           " << m_MunSrc.GetAsString()
       << "\tNumber Of Sources:         " << m_ui32NumSrcs               << "\n"
       << "\tGeometry Index:            " << m_ui16GeometryIndex         << "\n"
       << "\tSource Type:               " << m_ui32SrcType               << "\n"
       << "\tBarrage Rate:              " << m_f32BarrageRate            << "\n"
       << "\tBarrage Duration:          " << m_f32BarrageDuration        << "\n"
       << "\tBarrage Crosswind Length:  " << m_f32BarrageCrosswindLength << "\n"
       << "\tBarrage Downwind Length:   " << m_f32BarrageDownwindLength  << "\n"
       << "\tDetonation Velocity:       " << m_DetVel.GetAsString();

    return ss.str();
}